

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3cTestPackage.cpp
# Opt level: O0

void __thiscall es3cts::TestCaseWrapper::deinit(TestCaseWrapper *this,TestCase *testCase)

{
  Context *pCVar1;
  RenderContext *renderCtx;
  ContextInfo *ctxInfo;
  TestCase *testCase_local;
  TestCaseWrapper *this_local;
  
  (*(testCase->super_TestNode)._vptr_TestNode[3])();
  pCVar1 = deqp::TestPackage::getContext(&this->m_testPackage->super_TestPackage);
  renderCtx = deqp::Context::getRenderContext(pCVar1);
  pCVar1 = deqp::TestPackage::getContext(&this->m_testPackage->super_TestPackage);
  ctxInfo = deqp::Context::getContextInfo(pCVar1);
  glu::resetState(renderCtx,ctxInfo);
  return;
}

Assistant:

void TestCaseWrapper::deinit(tcu::TestCase* testCase)
{
	testCase->deinit();

	glu::resetState(m_testPackage.getContext().getRenderContext(), m_testPackage.getContext().getContextInfo());
}